

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to8.h
# Opt level: O1

void ncnn::im2col_sgemm_pack4to8_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  uint _h;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  int *piVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  int nn;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  _func_int ***ppp_Var33;
  undefined1 (*pauVar34) [32];
  undefined1 (*pauVar35) [32];
  ulong uVar36;
  float *pfVar37;
  undefined1 (*pauVar38) [16];
  ulong uVar39;
  int iVar40;
  uint uVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  float zeros [8];
  Mat local_b8;
  ulong local_68;
  void *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar3 = bottom_im2col->w;
  uVar30 = (ulong)(int)uVar3;
  iVar4 = bottom_im2col->h;
  _h = bottom_im2col->c;
  local_68 = (ulong)(uint)top_blob->c;
  local_60 = _bias->data;
  local_b8.cstep = 0;
  local_b8.data = (Allocator *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elempack = 0;
  iVar40 = iVar4 * 8;
  if ((long)uVar30 < 8) {
    iVar40 = iVar4;
  }
  local_b8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  uVar41 = (uVar3 & 7) + (uVar3 >> 3);
  if ((long)uVar30 < 8) {
    uVar41 = uVar3;
  }
  local_b8.elemsize._4_4_ = (int)local_b8.refcount;
  local_b8.allocator = (Allocator *)local_b8.data;
  local_b8.dims = (int)local_b8.refcount;
  local_b8.w = local_b8.refcount._4_4_;
  local_b8.c = local_b8.elempack;
  Mat::create(&local_b8,iVar40,_h,uVar41,0x10,4,opt->workspace_allocator);
  if (0 < (int)uVar3 >> 3) {
    lVar29 = 0x40;
    uVar32 = 0;
    do {
      if (0 < (int)_h) {
        ppp_Var33 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    local_b8.cstep * uVar32 *
                    CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
        uVar36 = 0;
        do {
          if (0 < iVar4) {
            pauVar38 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar36 + lVar29);
            iVar40 = iVar4;
            do {
              auVar11 = vunpcklps_avx(pauVar38[-4],pauVar38[-3]);
              auVar12 = vunpcklps_avx(pauVar38[-2],pauVar38[-1]);
              auVar7 = vunpckhps_avx(pauVar38[-4],pauVar38[-3]);
              auVar8 = vunpckhps_avx(pauVar38[-2],pauVar38[-1]);
              auVar5 = vmovlhps_avx(auVar11,auVar12);
              auVar12 = vunpckhpd_avx(auVar11,auVar12);
              auVar11 = vmovlhps_avx(auVar7,auVar8);
              auVar6 = vunpckhpd_avx(auVar7,auVar8);
              auVar8 = vunpcklps_avx(*pauVar38,pauVar38[1]);
              auVar13 = vunpcklps_avx(pauVar38[2],pauVar38[3]);
              auVar9 = vunpckhps_avx(*pauVar38,pauVar38[1]);
              auVar10 = vunpckhps_avx(pauVar38[2],pauVar38[3]);
              auVar7 = vmovlhps_avx(auVar8,auVar13);
              auVar13 = vunpckhpd_avx(auVar8,auVar13);
              auVar8 = vmovlhps_avx(auVar9,auVar10);
              auVar9 = vunpckhpd_avx(auVar9,auVar10);
              *(undefined1 (*) [16])ppp_Var33 = auVar5;
              *(undefined1 (*) [16])(ppp_Var33 + 2) = auVar7;
              *(undefined1 (*) [16])(ppp_Var33 + 4) = auVar12;
              *(undefined1 (*) [16])(ppp_Var33 + 6) = auVar13;
              *(undefined1 (*) [16])(ppp_Var33 + 8) = auVar11;
              *(undefined1 (*) [16])(ppp_Var33 + 10) = auVar8;
              *(undefined1 (*) [16])(ppp_Var33 + 0xc) = auVar6;
              *(undefined1 (*) [16])(ppp_Var33 + 0xe) = auVar9;
              ppp_Var33 = ppp_Var33 + 0x10;
              pauVar38 = (undefined1 (*) [16])(*pauVar38 + (long)(int)(uVar3 * 4) * 4);
              iVar40 = iVar40 + -1;
            } while (iVar40 != 0);
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != _h);
      }
      uVar32 = uVar32 + 1;
      lVar29 = lVar29 + 0x80;
    } while (uVar32 != (uint)((int)uVar3 >> 3));
  }
  uVar32 = uVar30 & 0xfffffffffffffff8;
  if ((uint)uVar32 != uVar3) {
    lVar29 = uVar32 << 4;
    do {
      if (0 < (int)_h) {
        uVar41 = (uint)uVar32;
        uVar31 = uVar41 + 7;
        if (-1 < (int)uVar41) {
          uVar31 = uVar41;
        }
        ppp_Var33 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    (long)(int)(((int)uVar31 >> 3) + (uVar41 - (uVar31 & 0xfffffff8))) *
                    local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize)
                    );
        uVar36 = 0;
        do {
          if (0 < iVar4) {
            pauVar38 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar36 + lVar29);
            iVar40 = iVar4;
            do {
              *(undefined1 (*) [16])ppp_Var33 = *pauVar38;
              ppp_Var33 = ppp_Var33 + 2;
              pauVar38 = (undefined1 (*) [16])(*pauVar38 + (long)(int)(uVar3 * 4) * 4);
              iVar40 = iVar40 + -1;
            } while (iVar40 != 0);
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != _h);
      }
      uVar32 = uVar32 + 1;
      lVar29 = lVar29 + 0x10;
    } while ((long)uVar32 < (long)uVar30);
  }
  if (0 < (int)local_68) {
    iVar40 = _h * iVar4 * 4;
    uVar32 = 0;
    do {
      pauVar34 = (undefined1 (*) [32])
                 (top_blob->cstep * uVar32 * top_blob->elemsize + (long)top_blob->data);
      pauVar35 = (undefined1 (*) [32])(uVar32 * 0x20 + (long)local_60);
      if (local_60 == (void *)0x0) {
        pauVar35 = (undefined1 (*) [32])&local_58;
      }
      local_58 = 0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      if ((int)uVar3 < 8) {
        uVar36 = 0;
      }
      else {
        lVar29 = 0;
        uVar39 = 0;
        do {
          auVar53 = *pauVar35;
          auVar52 = auVar53;
          auVar51 = auVar53;
          auVar50 = auVar53;
          auVar49 = auVar53;
          auVar48 = auVar53;
          auVar47 = auVar53;
          auVar45 = auVar53;
          if (0 < (int)(_h * iVar4 * 4)) {
            lVar42 = local_b8.cstep *
                     CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize) * lVar29;
            lVar43 = 0;
            iVar44 = iVar40;
            auVar46 = auVar53;
            auVar14 = auVar53;
            auVar15 = auVar53;
            auVar16 = auVar53;
            auVar17 = auVar53;
            auVar18 = auVar53;
            auVar27 = auVar53;
            auVar28 = auVar53;
            do {
              pfVar37 = (float *)((long)kernel->data +
                                 lVar43 + kernel->cstep * uVar32 * kernel->elemsize);
              fVar19 = *pfVar37;
              fVar20 = pfVar37[1];
              fVar21 = pfVar37[2];
              fVar22 = pfVar37[3];
              fVar23 = pfVar37[4];
              fVar24 = pfVar37[5];
              fVar25 = pfVar37[6];
              fVar1 = *(float *)((long)(_func_int ***)local_b8.data + lVar43 + lVar42);
              fVar2 = *(float *)((long)(_func_int ***)local_b8.data + lVar43 + lVar42 + 4);
              auVar53._0_4_ = fVar1 * fVar19 + auVar18._0_4_;
              auVar53._4_4_ = fVar1 * fVar20 + auVar18._4_4_;
              auVar53._8_4_ = fVar1 * fVar21 + auVar18._8_4_;
              auVar53._12_4_ = fVar1 * fVar22 + auVar18._12_4_;
              auVar53._16_4_ = fVar1 * fVar23 + auVar18._16_4_;
              auVar53._20_4_ = fVar1 * fVar24 + auVar18._20_4_;
              auVar53._24_4_ = fVar1 * fVar25 + auVar18._24_4_;
              auVar53._28_4_ = fVar1 + auVar18._28_4_;
              auVar52._0_4_ = fVar2 * fVar19 + auVar17._0_4_;
              auVar52._4_4_ = fVar2 * fVar20 + auVar17._4_4_;
              auVar52._8_4_ = fVar2 * fVar21 + auVar17._8_4_;
              auVar52._12_4_ = fVar2 * fVar22 + auVar17._12_4_;
              auVar52._16_4_ = fVar2 * fVar23 + auVar17._16_4_;
              auVar52._20_4_ = fVar2 * fVar24 + auVar17._20_4_;
              auVar52._24_4_ = fVar2 * fVar25 + auVar17._24_4_;
              auVar52._28_4_ = fVar1 + auVar17._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                                lVar43 + lVar42);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                                lVar43 + lVar42 + 4);
              auVar51._0_4_ = fVar1 * fVar19 + auVar16._0_4_;
              auVar51._4_4_ = fVar1 * fVar20 + auVar16._4_4_;
              auVar51._8_4_ = fVar1 * fVar21 + auVar16._8_4_;
              auVar51._12_4_ = fVar1 * fVar22 + auVar16._12_4_;
              auVar51._16_4_ = fVar1 * fVar23 + auVar16._16_4_;
              auVar51._20_4_ = fVar1 * fVar24 + auVar16._20_4_;
              auVar51._24_4_ = fVar1 * fVar25 + auVar16._24_4_;
              auVar51._28_4_ = fVar1 + auVar16._28_4_;
              auVar50._0_4_ = fVar2 * fVar19 + auVar15._0_4_;
              auVar50._4_4_ = fVar2 * fVar20 + auVar15._4_4_;
              auVar50._8_4_ = fVar2 * fVar21 + auVar15._8_4_;
              auVar50._12_4_ = fVar2 * fVar22 + auVar15._12_4_;
              auVar50._16_4_ = fVar2 * fVar23 + auVar15._16_4_;
              auVar50._20_4_ = fVar2 * fVar24 + auVar15._20_4_;
              auVar50._24_4_ = fVar2 * fVar25 + auVar15._24_4_;
              auVar50._28_4_ = fVar1 + auVar15._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_b8.data + 0x10))->_vptr_Allocator
                                + lVar43 + lVar42);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_b8.data + 0x10))->_vptr_Allocator
                                + lVar43 + lVar42 + 4);
              auVar49._0_4_ = fVar1 * fVar19 + auVar14._0_4_;
              auVar49._4_4_ = fVar1 * fVar20 + auVar14._4_4_;
              auVar49._8_4_ = fVar1 * fVar21 + auVar14._8_4_;
              auVar49._12_4_ = fVar1 * fVar22 + auVar14._12_4_;
              auVar49._16_4_ = fVar1 * fVar23 + auVar14._16_4_;
              auVar49._20_4_ = fVar1 * fVar24 + auVar14._20_4_;
              auVar49._24_4_ = fVar1 * fVar25 + auVar14._24_4_;
              auVar49._28_4_ = fVar1 + auVar14._28_4_;
              auVar48._0_4_ = fVar2 * fVar19 + auVar46._0_4_;
              auVar48._4_4_ = fVar2 * fVar20 + auVar46._4_4_;
              auVar48._8_4_ = fVar2 * fVar21 + auVar46._8_4_;
              auVar48._12_4_ = fVar2 * fVar22 + auVar46._12_4_;
              auVar48._16_4_ = fVar2 * fVar23 + auVar46._16_4_;
              auVar48._20_4_ = fVar2 * fVar24 + auVar46._20_4_;
              auVar48._24_4_ = fVar2 * fVar25 + auVar46._24_4_;
              auVar48._28_4_ = fVar1 + auVar46._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_b8.data + 0x18))->_vptr_Allocator
                                + lVar43 + lVar42);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_b8.data + 0x18))->_vptr_Allocator
                                + lVar43 + lVar42 + 4);
              auVar47._0_4_ = fVar1 * fVar19 + auVar28._0_4_;
              auVar47._4_4_ = fVar1 * fVar20 + auVar28._4_4_;
              auVar47._8_4_ = fVar1 * fVar21 + auVar28._8_4_;
              auVar47._12_4_ = fVar1 * fVar22 + auVar28._12_4_;
              auVar47._16_4_ = fVar1 * fVar23 + auVar28._16_4_;
              auVar47._20_4_ = fVar1 * fVar24 + auVar28._20_4_;
              auVar47._24_4_ = fVar1 * fVar25 + auVar28._24_4_;
              auVar47._28_4_ = fVar1 + auVar28._28_4_;
              auVar45._0_4_ = fVar2 * fVar19 + auVar27._0_4_;
              auVar45._4_4_ = fVar2 * fVar20 + auVar27._4_4_;
              auVar45._8_4_ = fVar2 * fVar21 + auVar27._8_4_;
              auVar45._12_4_ = fVar2 * fVar22 + auVar27._12_4_;
              auVar45._16_4_ = fVar2 * fVar23 + auVar27._16_4_;
              auVar45._20_4_ = fVar2 * fVar24 + auVar27._20_4_;
              auVar45._24_4_ = fVar2 * fVar25 + auVar27._24_4_;
              auVar45._28_4_ = pfVar37[7] + auVar27._28_4_;
              lVar43 = lVar43 + 0x20;
              iVar44 = iVar44 + -1;
              auVar46 = auVar48;
              auVar14 = auVar49;
              auVar15 = auVar50;
              auVar16 = auVar51;
              auVar17 = auVar52;
              auVar18 = auVar53;
              auVar27 = auVar45;
              auVar28 = auVar47;
            } while (iVar44 != 0);
          }
          *pauVar34 = auVar53;
          pauVar34[1] = auVar52;
          pauVar34[2] = auVar51;
          pauVar34[3] = auVar50;
          pauVar34[4] = auVar49;
          pauVar34[5] = auVar48;
          pauVar34[6] = auVar47;
          pauVar34[7] = auVar45;
          pauVar34 = pauVar34 + 8;
          uVar36 = uVar39 + 8;
          lVar42 = uVar39 + 0xf;
          lVar29 = lVar29 + 1;
          uVar39 = uVar36;
        } while (lVar42 < (long)uVar30);
      }
      if ((int)uVar36 < (int)uVar3) {
        do {
          auVar46 = *pauVar35;
          if (0 < (int)(_h * iVar4 * 4)) {
            pfVar37 = (float *)(kernel->cstep * uVar32 * kernel->elemsize + (long)kernel->data);
            lVar29 = 0;
            auVar53 = auVar46;
            do {
              fVar1 = *(float *)((long)(_func_int ***)local_b8.data +
                                lVar29 * 4 +
                                local_b8.cstep *
                                CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize) *
                                (ulong)(((uint)uVar36 & 7) + ((uint)(uVar36 >> 3) & 0x1fffffff)));
              auVar46._0_4_ = fVar1 * *pfVar37 + auVar53._0_4_;
              auVar46._4_4_ = fVar1 * pfVar37[1] + auVar53._4_4_;
              auVar46._8_4_ = fVar1 * pfVar37[2] + auVar53._8_4_;
              auVar46._12_4_ = fVar1 * pfVar37[3] + auVar53._12_4_;
              auVar46._16_4_ = fVar1 * pfVar37[4] + auVar53._16_4_;
              auVar46._20_4_ = fVar1 * pfVar37[5] + auVar53._20_4_;
              auVar46._24_4_ = fVar1 * pfVar37[6] + auVar53._24_4_;
              auVar46._28_4_ = fVar1 + auVar53._28_4_;
              pfVar37 = pfVar37 + 8;
              lVar29 = lVar29 + 1;
              auVar53 = auVar46;
            } while (iVar40 != (int)lVar29);
          }
          *pauVar34 = auVar46;
          pauVar34 = pauVar34 + 1;
          uVar41 = (uint)uVar36 + 1;
          uVar36 = (ulong)uVar41;
        } while (uVar41 != uVar3);
      }
      uVar32 = uVar32 + 1;
    } while (uVar32 != local_68);
  }
  piVar26 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_b8.data != (Allocator *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4to8_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 16u, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + size % 8, 16u, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 16u, 4, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x8
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r1);
                    _mm_store_ps(tmpptr + 4 * 3, _r5);
                    _mm_store_ps(tmpptr + 4 * 4, _r2);
                    _mm_store_ps(tmpptr + 4 * 5, _r6);
                    _mm_store_ps(tmpptr + 4 * 6, _r3);
                    _mm_store_ps(tmpptr + 4 * 7, _r7);

                    img0 += size * 4;
                    tmpptr += 32;
                }
            }
        }

        remain_size_start += nn_size << 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                kptr += 8;
                tmpptr += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 8 * 2, _sum2);
            _mm256_store_ps(outptr0 + 8 * 3, _sum3);
            _mm256_store_ps(outptr0 + 8 * 4, _sum4);
            _mm256_store_ps(outptr0 + 8 * 5, _sum5);
            _mm256_store_ps(outptr0 + 8 * 6, _sum6);
            _mm256_store_ps(outptr0 + 8 * 7, _sum7);

            outptr0 += 8 * 8;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);
                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

                kptr += 8;
                tmpptr += 1;
            }

            _mm256_store_ps(outptr0, _sum0);
            outptr0 += 8;
        }
    }
}